

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_comparable.c
# Opt level: O3

int comparable_callback_int(comparable a,comparable b)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*b <= *a) {
    uVar1 = (uint)(*b < *a);
  }
  return uVar1;
}

Assistant:

int comparable_callback_int(const comparable a, const comparable b)
{
	const int *int_ptr_a = a;
	const int *int_ptr_b = b;

	const int int_var_a = *int_ptr_a;
	const int int_var_b = *int_ptr_b;

	if (int_var_a < int_var_b)
	{
		return -1;
	}
	else if (int_var_a > int_var_b)
	{
		return 1;
	}
	else
	{
		return 0;
	}
}